

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O1

UnicodeString * __thiscall icu_63::UnicodeString::append(UnicodeString *this,UChar32 srcChar)

{
  bool bVar1;
  ulong uVar2;
  ulong in_RAX;
  int32_t srcLength;
  UChar buffer [2];
  undefined8 uStack_8;
  
  uStack_8._0_4_ = (undefined4)in_RAX;
  if ((uint)srcChar < 0x10000) {
    uStack_8._6_2_ = (undefined2)(in_RAX >> 0x30);
    uStack_8._0_6_ = CONCAT24((short)srcChar,(undefined4)uStack_8);
    bVar1 = true;
    srcLength = 1;
    uVar2 = uStack_8;
  }
  else {
    srcLength = 0;
    bVar1 = false;
    uVar2 = in_RAX;
    if ((uint)srcChar < 0x110000) {
      uStack_8._0_6_ = CONCAT24((short)((uint)srcChar >> 10) + -0x2840,(undefined4)uStack_8);
      uStack_8 = CONCAT26((short)srcChar,(undefined6)uStack_8) & 0x3ffffffffffffff |
                 0xdc00000000000000;
      bVar1 = true;
      srcLength = 2;
      uVar2 = uStack_8;
    }
  }
  uStack_8 = uVar2;
  if (bVar1) {
    this = doAppend(this,(UChar *)((long)&uStack_8 + 4),0,srcLength);
  }
  return this;
}

Assistant:

UnicodeString&
UnicodeString::append(UChar32 srcChar) {
  UChar buffer[U16_MAX_LENGTH];
  int32_t _length = 0;
  UBool isError = FALSE;
  U16_APPEND(buffer, _length, U16_MAX_LENGTH, srcChar, isError);
  // We test isError so that the compiler does not complain that we don't.
  // If isError then _length==0 which turns the doAppend() into a no-op anyway.
  return isError ? *this : doAppend(buffer, 0, _length);
}